

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

char * al_get_config_value(ALLEGRO_CONFIG *config,char *section,char *key)

{
  ALLEGRO_USTR *key_00;
  ALLEGRO_USTR *key_01;
  void *pvVar1;
  char *pcVar2;
  ALLEGRO_USTR_INFO key_info;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR_INFO AStack_38;
  ALLEGRO_USTR_INFO local_28;
  
  if (section == (char *)0x0) {
    section = "";
  }
  key_00 = al_ref_cstr(&local_28,section);
  key_01 = al_ref_cstr(&AStack_38,key);
  pvVar1 = _al_aa_search((Aatree *)config->tree,key_00,cmp_ustr);
  if ((pvVar1 != (void *)0x0) &&
     (pvVar1 = _al_aa_search(*(Aatree **)((long)pvVar1 + 0x18),key_01,cmp_ustr),
     pvVar1 != (void *)0x0)) {
    pcVar2 = al_cstr(*(ALLEGRO_USTR **)((long)pvVar1 + 0x10));
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *al_get_config_value(const ALLEGRO_CONFIG *config,
   const char *section, const char *key)
{
   ALLEGRO_USTR_INFO section_info;
   ALLEGRO_USTR_INFO key_info;
   const ALLEGRO_USTR *usection;
   const ALLEGRO_USTR *ukey;
   const ALLEGRO_USTR *value;

   if (section == NULL) {
      section = "";
   }

   usection = al_ref_cstr(&section_info, section);
   ukey = al_ref_cstr(&key_info, key);

   if (config_get_value(config, usection, ukey, &value))
      return al_cstr(value);
   else
      return NULL;
}